

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O0

int mbedtls_arc4_crypt(mbedtls_arc4_context *ctx,size_t length,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  uchar *m;
  size_t i;
  int b;
  int a;
  int y;
  int x;
  uchar *output_local;
  uchar *input_local;
  size_t length_local;
  mbedtls_arc4_context *ctx_local;
  
  a = ctx->x;
  b = ctx->y;
  for (m = (uchar *)0x0; m < length; m = m + 1) {
    a = a + 1U & 0xff;
    bVar1 = ctx->m[a];
    b = b + (uint)bVar1 & 0xff;
    bVar2 = ctx->m[b];
    ctx->m[a] = bVar2;
    ctx->m[b] = bVar1;
    output[(long)m] = input[(long)m] ^ ctx->m[(uint)bVar1 + (uint)bVar2 & 0xff];
  }
  ctx->x = a;
  ctx->y = b;
  return 0;
}

Assistant:

int mbedtls_arc4_crypt( mbedtls_arc4_context *ctx, size_t length, const unsigned char *input,
                unsigned char *output )
{
    int x, y, a, b;
    size_t i;
    unsigned char *m;

    x = ctx->x;
    y = ctx->y;
    m = ctx->m;

    for( i = 0; i < length; i++ )
    {
        x = ( x + 1 ) & 0xFF; a = m[x];
        y = ( y + a ) & 0xFF; b = m[y];

        m[x] = (unsigned char) b;
        m[y] = (unsigned char) a;

        output[i] = (unsigned char)
            ( input[i] ^ m[(unsigned char)( a + b )] );
    }

    ctx->x = x;
    ctx->y = y;

    return( 0 );
}